

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall
r_exec::Group::_initiate_sln_propagation
          (Group *this,Code *object,double change,double source_sln_thr,
          vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *path)

{
  ushort uVar1;
  bool bVar2;
  char cVar3;
  ushort uVar4;
  reference ppCVar5;
  Code *object_00;
  Code **ppCVar6;
  undefined8 extraout_RDX;
  double extraout_XMM0_Qa;
  iterator local_88;
  iterator local_78;
  undefined1 local_68 [8];
  const_iterator m;
  uint16_t i;
  Code *node;
  iterator __end2;
  iterator __begin2;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *__range2;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *path_local;
  double source_sln_thr_local;
  double change_local;
  Code *object_local;
  Group *this_local;
  
  change_local = (double)object;
  object_local = (Code *)this;
  (*(object->super__Object)._vptr__Object[0x15])();
  if (extraout_XMM0_Qa < ABS(change)) {
    __end2 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::begin(path);
    node = (Code *)std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::end(path);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<r_code::Code_**,_std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>_>
                                       *)&node), bVar2) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<r_code::Code_**,_std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>_>
                ::operator*(&__end2);
      if (*ppCVar5 == (Code *)change_local) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<r_code::Code_**,_std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::push_back
              (path,(value_type *)&change_local);
    (**(code **)(*(long *)change_local + 0x20))(change_local,0);
    cVar3 = r_code::Atom::getDescriptor();
    if (cVar3 == -0x3c) {
      for (m._list._6_2_ = 0; uVar1 = m._list._6_2_,
          uVar4 = (**(code **)(*(long *)change_local + 0x50))(), uVar1 < uVar4;
          m._list._6_2_ = m._list._6_2_ + 1) {
        object_00 = (Code *)(**(code **)(*(long *)change_local + 0x48))
                                      (change_local,m._list._6_2_,extraout_RDX,m._list._6_2_);
        _propagate_sln(this,object_00,change,source_sln_thr,path);
      }
    }
    (**(code **)(*(long *)change_local + 0x98))();
    r_code::list<r_code::Code_*>::const_iterator::const_iterator((const_iterator *)local_68);
    local_78 = r_code::list<r_code::Code_*>::begin
                         ((list<r_code::Code_*> *)((long)change_local + 0x18));
    r_code::list<r_code::Code_*>::const_iterator::operator=((const_iterator *)local_68,&local_78);
    while( true ) {
      local_88 = r_code::list<r_code::Code_*>::end
                           ((list<r_code::Code_*> *)((long)change_local + 0x18));
      bVar2 = r_code::list<r_code::Code_*>::_iterator::operator!=
                        ((_iterator *)local_68,&local_88.super__iterator);
      if (!bVar2) break;
      ppCVar6 = r_code::list<r_code::Code_*>::const_iterator::operator*((const_iterator *)local_68);
      _propagate_sln(this,*ppCVar6,change,source_sln_thr,path);
      r_code::list<r_code::Code_*>::const_iterator::operator++((const_iterator *)local_68);
    }
    (**(code **)(*(long *)change_local + 0xa0))();
  }
  return;
}

Assistant:

void Group::_initiate_sln_propagation(Code *object, double change, double source_sln_thr, std::vector<Code *> &path) const
{
    if (fabs(change) > object->get_psln_thr()) {
        // prevent loops.
        for (Code  *node : path) {
            if (node == object) {
                return;
            }
        }

        path.push_back(object);

        if (object->code(0).getDescriptor() == Atom::MARKER) // if marker, propagate to references.
            for (uint16_t i = 0; i < object->references_size(); ++i) {
                _propagate_sln(object->get_reference(i), change, source_sln_thr, path);
            }

        // propagate to markers
        object->acq_markers();
        r_code::list<Code *>::const_iterator m;

        for (m = object->markers.begin(); m != object->markers.end(); ++m) {
            _propagate_sln(*m, change, source_sln_thr, path);
        }

        object->rel_markers();
    }
}